

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_extension.cpp
# Opt level: O0

void duckdb::JemallocExtension::ThreadFlush(idx_t threshold)

{
  unsigned_long uVar1;
  ulong in_RDI;
  idx_t in_stack_00000008;
  string purge_arena;
  char *in_stack_ffffffffffffffc0;
  string local_28 [32];
  ulong local_8;
  
  local_8 = in_RDI;
  uVar1 = GetJemallocCTL<unsigned_long>(in_stack_ffffffffffffffc0);
  if (uVar1 <= local_8) {
    SetJemallocCTL((char *)0x245303a);
    GetJemallocCTL<unsigned_int>(in_stack_ffffffffffffffc0);
    PurgeArenaString_abi_cxx11_(in_stack_00000008);
    ::std::__cxx11::string::c_str();
    SetJemallocCTL((char *)0x245306b);
    SetJemallocCTL((char *)0x2453079);
    ::std::__cxx11::string::~string(local_28);
  }
  return;
}

Assistant:

void JemallocExtension::ThreadFlush(idx_t threshold) {
	// We flush after exceeding the threshold
	if (GetJemallocCTL<uint64_t>("thread.peak.read") > threshold) {
		return;
	}

	// Flush thread-local cache
	SetJemallocCTL("thread.tcache.flush");

	// Flush this thread's arena
	const auto purge_arena = PurgeArenaString(idx_t(GetJemallocCTL<unsigned>("thread.arena")));
	SetJemallocCTL(purge_arena.c_str());

	// Reset the peak after resetting
	SetJemallocCTL("thread.peak.reset");
}